

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O3

DisplayAction *
setUsedDimensions(DisplayAction *__return_storage_ptr__,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *dimensions)

{
  uint uVar1;
  offset_in_Display_to_subr in_R9;
  ulong uVar2;
  stringstream s;
  char local_1f8 [16];
  code *local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (*(long *)(dimensions + 8) != *(long *)dimensions) {
    uVar1 = 1;
    do {
      if (uVar1 != 1) {
        local_1f8[0] = 0x3a;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f8,1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar2 < (ulong)(*(long *)(dimensions + 8) - *(long *)dimensions >> 2));
  }
  std::__cxx11::stringbuf::str();
  local_1f8[0] = '\0';
  local_1f8[1] = '\0';
  local_1f8[2] = '\0';
  local_1f8[3] = '\0';
  local_1f8[4] = '\0';
  local_1f8[5] = '\0';
  local_1f8[6] = '\0';
  local_1f8[7] = '\0';
  local_1f8[8] = '\0';
  local_1f8[9] = '\0';
  local_1f8[10] = '\0';
  local_1f8[0xb] = '\0';
  local_1f8[0xc] = '\0';
  local_1f8[0xd] = '\0';
  local_1f8[0xe] = '\0';
  local_1f8[0xf] = '\0';
  local_1e8 = Display::setUsedDimensions;
  uStack_1e0 = 0;
  DisplayAction::DisplayAction(__return_storage_ptr__,0,&local_1d8,0,0,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setUsedDimensions( const vector<uint> &dimensions)
{
	stringstream s;
	for (uint i=0; i<dimensions.size(); ++i) {
		if (i) s << ':';
		s << dimensions[i];
	}
	return DisplayAction(0, s.str(), 0, 0, &Display::setUsedDimensions);
}